

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  int iVar1;
  TestInfo *pTVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  string *psVar6;
  TestInfo *in_RDX;
  char *in_RSI;
  TestInfo *in_RDI;
  string detail;
  string summary;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  string kTestcase;
  TestResult *result;
  TestInfo *in_stack_fffffffffffffb58;
  TestPartResult *in_stack_fffffffffffffb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  TestResult *in_stack_fffffffffffffb70;
  ostream *in_stack_fffffffffffffb80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb88;
  allocator *paVar7;
  TestResult *in_stack_fffffffffffffc28;
  string *in_stack_fffffffffffffc38;
  string *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  ostream *in_stack_fffffffffffffc50;
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  TimeInMillis in_stack_fffffffffffffcf8;
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  TestPartResult *local_260;
  int local_258;
  int local_254;
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  undefined1 local_119 [40];
  undefined1 local_f1 [40];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  TestResult *local_20;
  TestInfo *local_18;
  char *local_10;
  TestInfo *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = TestInfo::result(in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"testcase",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::operator<<((ostream *)local_8,"    <testcase");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"name",&local_79);
  pcVar5 = TestInfo::name((TestInfo *)0x11772a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,pcVar5,&local_a1);
  OutputXmlAttribute(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                     in_stack_fffffffffffffc38);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pcVar5 = TestInfo::value_param(in_stack_fffffffffffffb58);
  if (pcVar5 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"value_param",&local_c9);
    in_stack_fffffffffffffc50 = (ostream *)TestInfo::value_param(in_stack_fffffffffffffb58);
    in_stack_fffffffffffffc48 = (string *)local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_f1 + 1),(char *)in_stack_fffffffffffffc50,
               (allocator *)in_stack_fffffffffffffc48);
    OutputXmlAttribute(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40
                       ,in_stack_fffffffffffffc38);
    std::__cxx11::string::~string((string *)(local_f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_f1);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  psVar6 = (string *)TestInfo::type_param(in_stack_fffffffffffffb58);
  if (psVar6 != (string *)0x0) {
    in_stack_fffffffffffffc38 = (string *)local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_119 + 1),"type_param",(allocator *)in_stack_fffffffffffffc38);
    in_stack_fffffffffffffc28 = (TestResult *)TestInfo::type_param(in_stack_fffffffffffffb58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,(char *)in_stack_fffffffffffffc28,&local_141);
    OutputXmlAttribute(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,psVar6,
                       in_stack_fffffffffffffc38);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    std::__cxx11::string::~string((string *)(local_119 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_119);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"status",&local_169);
  bVar3 = TestInfo::should_run(local_18);
  pcVar5 = "notrun";
  if (bVar3) {
    pcVar5 = "run";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,pcVar5,&local_191);
  OutputXmlAttribute(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,psVar6,
                     in_stack_fffffffffffffc38);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  paVar7 = &local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"time",paVar7);
  TestResult::elapsed_time(local_20);
  FormatTimeInMillisAsSeconds_abi_cxx11_(in_stack_fffffffffffffcf8);
  OutputXmlAttribute(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,psVar6,
                     in_stack_fffffffffffffc38);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"classname",&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,local_10,&local_229);
  OutputXmlAttribute(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,psVar6,
                     in_stack_fffffffffffffc38);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  pTVar2 = local_8;
  TestPropertiesAsXmlAttributes_abi_cxx11_(in_stack_fffffffffffffc28);
  std::operator<<((ostream *)pTVar2,local_250);
  std::__cxx11::string::~string(local_250);
  local_254 = 0;
  for (local_258 = 0; iVar1 = local_258,
      iVar4 = TestResult::total_part_count((TestResult *)0x117eeb), iVar1 < iVar4;
      local_258 = local_258 + 1) {
    local_260 = TestResult::GetTestPartResult
                          (in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20)
                          );
    bVar3 = TestPartResult::failed(local_260);
    if (bVar3) {
      local_254 = local_254 + 1;
      if (local_254 == 1) {
        std::operator<<((ostream *)local_8,">\n");
      }
      psVar6 = (string *)TestPartResult::file_name(in_stack_fffffffffffffb60);
      TestPartResult::line_number(local_260);
      FormatCompilerIndependentFileLocation_abi_cxx11_(pcVar5,(int)((ulong)paVar7 >> 0x20));
      std::operator+(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
      in_stack_fffffffffffffb88 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           TestPartResult::summary((TestPartResult *)0x11817a);
      std::operator+(in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(local_2c0);
      in_stack_fffffffffffffb80 = std::operator<<((ostream *)local_8,"      <failure message=\"");
      in_stack_fffffffffffffb70 = (TestResult *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_300,(char *)in_stack_fffffffffffffb70,(allocator *)&stack0xfffffffffffffcff);
      EscapeXmlAttribute(&in_stack_fffffffffffffb58->test_case_name_);
      in_stack_fffffffffffffb68 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(in_stack_fffffffffffffb80,local_2e0);
      std::operator<<((ostream *)in_stack_fffffffffffffb68,"\" type=\"\">");
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcff);
      std::operator+(in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80);
      in_stack_fffffffffffffb60 =
           (TestPartResult *)TestPartResult::message((TestPartResult *)0x118297);
      std::operator+(in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(local_348);
      in_stack_fffffffffffffb58 = local_8;
      RemoveInvalidXmlCharacters(psVar6);
      std::__cxx11::string::c_str();
      OutputXmlCDataSection((ostream *)in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68);
      std::__cxx11::string::~string(local_368);
      std::operator<<((ostream *)local_8,"</failure>\n");
      std::__cxx11::string::~string(local_328);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_280);
    }
  }
  if (local_254 == 0) {
    std::operator<<((ostream *)local_8," />\n");
  }
  else {
    std::operator<<((ostream *)local_8,"    </testcase>\n");
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestcase, "name", test_info.name());

  if (test_info.value_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "type_param", test_info.type_param());
  }

  OutputXmlAttribute(stream, kTestcase, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestcase, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(stream, kTestcase, "classname", test_case_name);
  *stream << TestPropertiesAsXmlAttributes(result);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}